

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void mbedtls_sha512_process(mbedtls_sha512_context *ctx,uchar *data)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_2f8;
  uint64_t H;
  uint64_t G;
  uint64_t F;
  uint64_t E;
  uint64_t D;
  uint64_t C;
  uint64_t B;
  uint64_t A;
  uint64_t W [80];
  uint64_t temp2;
  uint64_t temp1;
  int i;
  uchar *data_local;
  mbedtls_sha512_context *ctx_local;
  
  for (temp1._4_4_ = 0; temp1._4_4_ < 0x10; temp1._4_4_ = temp1._4_4_ + 1) {
    W[(long)temp1._4_4_ + -1] =
         (ulong)data[temp1._4_4_ << 3] << 0x38 | (ulong)data[temp1._4_4_ * 8 + 1] << 0x30 |
         (ulong)data[temp1._4_4_ * 8 + 2] << 0x28 | (ulong)data[temp1._4_4_ * 8 + 3] << 0x20 |
         (ulong)data[temp1._4_4_ * 8 + 4] << 0x18 | (ulong)data[temp1._4_4_ * 8 + 5] << 0x10 |
         (ulong)data[temp1._4_4_ * 8 + 6] << 8 | (ulong)data[temp1._4_4_ * 8 + 7];
  }
  for (; temp1._4_4_ < 0x50; temp1._4_4_ = temp1._4_4_ + 1) {
    W[(long)temp1._4_4_ + -1] =
         ((W[(long)(temp1._4_4_ + -2) + -1] >> 0x13 | W[(long)(temp1._4_4_ + -2) + -1] << 0x2d) ^
          (W[(long)(temp1._4_4_ + -2) + -1] >> 0x3d | W[(long)(temp1._4_4_ + -2) + -1] << 3) ^
         W[(long)(temp1._4_4_ + -2) + -1] >> 6) + W[(long)(temp1._4_4_ + -7) + -1] +
         ((W[(long)(temp1._4_4_ + -0xf) + -1] >> 1 | W[(long)(temp1._4_4_ + -0xf) + -1] << 0x3f) ^
          (W[(long)(temp1._4_4_ + -0xf) + -1] >> 8 | W[(long)(temp1._4_4_ + -0xf) + -1] << 0x38) ^
         W[(long)(temp1._4_4_ + -0xf) + -1] >> 7) + W[(long)(temp1._4_4_ + -0x10) + -1];
  }
  B = ctx->state[0];
  C = ctx->state[1];
  D = ctx->state[2];
  E = ctx->state[3];
  F = ctx->state[4];
  G = ctx->state[5];
  H = ctx->state[6];
  local_2f8 = ctx->state[7];
  temp1._4_4_ = 0;
  do {
    lVar1 = local_2f8 + ((F >> 0xe | F << 0x32) ^ (F >> 0x12 | F << 0x2e) ^ (F >> 0x29 | F << 0x17))
            + (H ^ F & (G ^ H)) + K[temp1._4_4_] + W[(long)temp1._4_4_ + -1];
    uVar2 = lVar1 + E;
    local_2f8 = lVar1 + ((B >> 0x1c | B << 0x24) ^ (B >> 0x22 | B << 0x1e) ^ (B >> 0x27 | B << 0x19)
                        ) + (B & C | D & (B | C));
    lVar1 = H + ((uVar2 >> 0xe | uVar2 << 0x32) ^ (uVar2 >> 0x12 | uVar2 << 0x2e) ^
                (uVar2 >> 0x29 | uVar2 * 0x800000)) + (G ^ uVar2 & (F ^ G)) + K[temp1._4_4_ + 1] +
            W[(long)(temp1._4_4_ + 1) + -1];
    uVar3 = lVar1 + D;
    uVar4 = lVar1 + ((local_2f8 >> 0x1c | local_2f8 << 0x24) ^
                     (local_2f8 >> 0x22 | local_2f8 * 0x40000000) ^
                    (local_2f8 >> 0x27 | local_2f8 * 0x2000000)) +
                    (local_2f8 & B | C & (local_2f8 | B));
    lVar1 = G + ((uVar3 >> 0xe | uVar3 << 0x32) ^ (uVar3 >> 0x12 | uVar3 << 0x2e) ^
                (uVar3 >> 0x29 | uVar3 * 0x800000)) + (F ^ uVar3 & (uVar2 ^ F)) + K[temp1._4_4_ + 2]
            + W[(long)(temp1._4_4_ + 2) + -1];
    uVar5 = lVar1 + C;
    uVar6 = lVar1 + ((uVar4 >> 0x1c | uVar4 << 0x24) ^ (uVar4 >> 0x22 | uVar4 * 0x40000000) ^
                    (uVar4 >> 0x27 | uVar4 * 0x2000000)) +
                    (uVar4 & local_2f8 | B & (uVar4 | local_2f8));
    lVar1 = F + ((uVar5 >> 0xe | uVar5 << 0x32) ^ (uVar5 >> 0x12 | uVar5 << 0x2e) ^
                (uVar5 >> 0x29 | uVar5 * 0x800000)) + (uVar2 ^ uVar5 & (uVar3 ^ uVar2)) +
            K[temp1._4_4_ + 3] + W[(long)(temp1._4_4_ + 3) + -1];
    uVar7 = lVar1 + B;
    uVar8 = lVar1 + ((uVar6 >> 0x1c | uVar6 << 0x24) ^ (uVar6 >> 0x22 | uVar6 * 0x40000000) ^
                    (uVar6 >> 0x27 | uVar6 * 0x2000000)) +
                    (uVar6 & uVar4 | local_2f8 & (uVar6 | uVar4));
    lVar1 = uVar2 + ((uVar7 >> 0xe | uVar7 << 0x32) ^ (uVar7 >> 0x12 | uVar7 << 0x2e) ^
                    (uVar7 >> 0x29 | uVar7 * 0x800000)) + (uVar3 ^ uVar7 & (uVar5 ^ uVar3)) +
            K[temp1._4_4_ + 4] + W[(long)(temp1._4_4_ + 4) + -1];
    local_2f8 = lVar1 + local_2f8;
    E = lVar1 + ((uVar8 >> 0x1c | uVar8 << 0x24) ^ (uVar8 >> 0x22 | uVar8 * 0x40000000) ^
                (uVar8 >> 0x27 | uVar8 * 0x2000000)) + (uVar8 & uVar6 | uVar4 & (uVar8 | uVar6));
    lVar1 = uVar3 + ((local_2f8 >> 0xe | local_2f8 << 0x32) ^
                     (local_2f8 >> 0x12 | local_2f8 << 0x2e) ^
                    (local_2f8 >> 0x29 | local_2f8 * 0x800000)) +
            (uVar5 ^ local_2f8 & (uVar7 ^ uVar5)) + K[temp1._4_4_ + 5] +
            W[(long)(temp1._4_4_ + 5) + -1];
    H = lVar1 + uVar4;
    D = lVar1 + ((E >> 0x1c | E << 0x24) ^ (E >> 0x22 | E * 0x40000000) ^
                (E >> 0x27 | E * 0x2000000)) + (E & uVar8 | uVar6 & (E | uVar8));
    lVar1 = uVar5 + ((H >> 0xe | H << 0x32) ^ (H >> 0x12 | H << 0x2e) ^ (H >> 0x29 | H * 0x800000))
            + (uVar7 ^ H & (local_2f8 ^ uVar7)) + K[temp1._4_4_ + 6] +
            W[(long)(temp1._4_4_ + 6) + -1];
    G = lVar1 + uVar6;
    C = lVar1 + ((D >> 0x1c | D << 0x24) ^ (D >> 0x22 | D * 0x40000000) ^
                (D >> 0x27 | D * 0x2000000)) + (D & E | uVar8 & (D | E));
    lVar1 = uVar7 + ((G >> 0xe | G << 0x32) ^ (G >> 0x12 | G << 0x2e) ^ (G >> 0x29 | G * 0x800000))
            + (local_2f8 ^ G & (H ^ local_2f8)) + K[temp1._4_4_ + 7] +
            W[(long)(temp1._4_4_ + 7) + -1];
    F = lVar1 + uVar8;
    B = lVar1 + ((C >> 0x1c | C << 0x24) ^ (C >> 0x22 | C * 0x40000000) ^
                (C >> 0x27 | C * 0x2000000)) + (C & D | E & (C | D));
    temp1._4_4_ = temp1._4_4_ + 8;
  } while (temp1._4_4_ < 0x50);
  ctx->state[0] = B + ctx->state[0];
  ctx->state[1] = C + ctx->state[1];
  ctx->state[2] = D + ctx->state[2];
  ctx->state[3] = E + ctx->state[3];
  ctx->state[4] = F + ctx->state[4];
  ctx->state[5] = G + ctx->state[5];
  ctx->state[6] = H + ctx->state[6];
  ctx->state[7] = local_2f8 + ctx->state[7];
  return;
}

Assistant:

void mbedtls_sha512_process( mbedtls_sha512_context *ctx, const unsigned char data[128] )
{
    int i;
    uint64_t temp1, temp2, W[80];
    uint64_t A, B, C, D, E, F, G, H;

#define  SHR(x,n) (x >> n)
#define ROTR(x,n) (SHR(x,n) | (x << (64 - n)))

#define S0(x) (ROTR(x, 1) ^ ROTR(x, 8) ^  SHR(x, 7))
#define S1(x) (ROTR(x,19) ^ ROTR(x,61) ^  SHR(x, 6))

#define S2(x) (ROTR(x,28) ^ ROTR(x,34) ^ ROTR(x,39))
#define S3(x) (ROTR(x,14) ^ ROTR(x,18) ^ ROTR(x,41))

#define F0(x,y,z) ((x & y) | (z & (x | y)))
#define F1(x,y,z) (z ^ (x & (y ^ z)))

#define P(a,b,c,d,e,f,g,h,x,K)                  \
{                                               \
    temp1 = h + S3(e) + F1(e,f,g) + K + x;      \
    temp2 = S2(a) + F0(a,b,c);                  \
    d += temp1; h = temp1 + temp2;              \
}

    for( i = 0; i < 16; i++ )
    {
        GET_UINT64_BE( W[i], data, i << 3 );
    }

    for( ; i < 80; i++ )
    {
        W[i] = S1(W[i -  2]) + W[i -  7] +
               S0(W[i - 15]) + W[i - 16];
    }

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];
    E = ctx->state[4];
    F = ctx->state[5];
    G = ctx->state[6];
    H = ctx->state[7];
    i = 0;

    do
    {
        P( A, B, C, D, E, F, G, H, W[i], K[i] ); i++;
        P( H, A, B, C, D, E, F, G, W[i], K[i] ); i++;
        P( G, H, A, B, C, D, E, F, W[i], K[i] ); i++;
        P( F, G, H, A, B, C, D, E, W[i], K[i] ); i++;
        P( E, F, G, H, A, B, C, D, W[i], K[i] ); i++;
        P( D, E, F, G, H, A, B, C, W[i], K[i] ); i++;
        P( C, D, E, F, G, H, A, B, W[i], K[i] ); i++;
        P( B, C, D, E, F, G, H, A, W[i], K[i] ); i++;
    }
    while( i < 80 );

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
    ctx->state[4] += E;
    ctx->state[5] += F;
    ctx->state[6] += G;
    ctx->state[7] += H;
}